

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_reprioritize_stream
              (nghttp2_session *session,nghttp2_stream *stream,nghttp2_priority_spec *pri_spec_in)

{
  int iVar1;
  nghttp2_session *in_RDX;
  nghttp2_stream *in_RSI;
  nghttp2_session *in_RDI;
  nghttp2_priority_spec *pri_spec;
  void *in_stack_00000008;
  nghttp2_priority_spec pri_spec_default;
  nghttp2_stream *dep_stream;
  uint8_t in_stack_00000023;
  int rv;
  nghttp2_session *in_stack_ffffffffffffffc0;
  nghttp2_stream *in_stack_ffffffffffffffc8;
  nghttp2_stream *stream_00;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  stream_00 = (nghttp2_stream *)0x0;
  if (((in_RDI->server != '\0') || (in_RDI->pending_no_rfc7540_priorities == '\x01')) &&
     ((in_RDI->server == '\0' || (iVar1 = session_no_rfc7540_pri_no_fallback(in_RDI), iVar1 != 0))))
  {
    __assert_fail("(!session->server && session->pending_no_rfc7540_priorities != 1) || (session->server && !session_no_rfc7540_pri_no_fallback(session))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                  ,0x349,
                  "int nghttp2_session_reprioritize_stream(nghttp2_session *, nghttp2_stream *, const nghttp2_priority_spec *)"
                 );
  }
  if (*(int *)&(in_RDX->streams).table == in_RSI->stream_id) {
    __assert_fail("pri_spec->stream_id != stream->stream_id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                  ,0x34a,
                  "int nghttp2_session_reprioritize_stream(nghttp2_session *, nghttp2_stream *, const nghttp2_priority_spec *)"
                 );
  }
  iVar1 = nghttp2_stream_in_dep_tree(in_RSI);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    if (*(int *)&(in_RDX->streams).table != 0) {
      stream_00 = nghttp2_session_get_stream_raw
                            (in_stack_ffffffffffffffc0,(int32_t)((ulong)in_RDX >> 0x20));
      if ((stream_00 == (nghttp2_stream *)0x0) &&
         (iVar1 = session_detect_idle_stream(in_RDX,0), iVar1 != 0)) {
        nghttp2_priority_spec_default_init((nghttp2_priority_spec *)&stack0xffffffffffffffc4);
        stream_00 = nghttp2_session_open_stream
                              ((nghttp2_session *)pri_spec_in,rv,in_stack_00000023,
                               (nghttp2_priority_spec *)dep_stream,pri_spec_default._8_4_,
                               in_stack_00000008);
        if (stream_00 == (nghttp2_stream *)0x0) {
          return -0x385;
        }
      }
      else if ((stream_00 == (nghttp2_stream *)0x0) ||
              (iVar1 = nghttp2_stream_in_dep_tree(stream_00), iVar1 == 0)) {
        nghttp2_priority_spec_default_init((nghttp2_priority_spec *)&stack0xffffffffffffffc4);
        in_RDX = (nghttp2_session *)&stack0xffffffffffffffc4;
      }
    }
    if (*(int *)&(in_RDX->streams).table == 0) {
      stream_00 = &in_RDI->root;
    }
    else {
      iVar1 = nghttp2_stream_dep_find_ancestor(stream_00,in_RSI);
      if (iVar1 != 0) {
        nghttp2_stream_dep_remove_subtree((nghttp2_stream *)in_stack_ffffffffffffffc0);
        iVar1 = nghttp2_stream_dep_add_subtree
                          (in_stack_ffffffffffffffc8,(nghttp2_stream *)in_stack_ffffffffffffffc0);
        if (iVar1 != 0) {
          return iVar1;
        }
        in_stack_ffffffffffffffdc = 0;
      }
    }
    if (stream_00 == (nghttp2_stream *)0x0) {
      __assert_fail("dep_stream",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                    ,0x371,
                    "int nghttp2_session_reprioritize_stream(nghttp2_session *, nghttp2_stream *, const nghttp2_priority_spec *)"
                   );
    }
    if ((stream_00 == in_RSI->dep_prev) && (*(char *)&(in_RDX->streams).mem == '\0')) {
      nghttp2_stream_change_weight((nghttp2_stream *)in_RDI,(int32_t)((ulong)in_RSI >> 0x20));
      local_4 = 0;
    }
    else {
      nghttp2_stream_dep_remove_subtree((nghttp2_stream *)in_stack_ffffffffffffffc0);
      in_RSI->weight = *(int32_t *)((long)&(in_RDX->streams).table + 4);
      if (*(char *)&(in_RDX->streams).mem == '\0') {
        local_4 = nghttp2_stream_dep_add_subtree
                            (in_stack_ffffffffffffffc8,(nghttp2_stream *)in_stack_ffffffffffffffc0);
      }
      else {
        local_4 = nghttp2_stream_dep_insert_subtree
                            ((nghttp2_stream *)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),stream_00
                            );
      }
      if (local_4 == 0) {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int nghttp2_session_reprioritize_stream(
  nghttp2_session *session, nghttp2_stream *stream,
  const nghttp2_priority_spec *pri_spec_in) {
  int rv;
  nghttp2_stream *dep_stream = NULL;
  nghttp2_priority_spec pri_spec_default;
  const nghttp2_priority_spec *pri_spec = pri_spec_in;

  assert((!session->server && session->pending_no_rfc7540_priorities != 1) ||
         (session->server && !session_no_rfc7540_pri_no_fallback(session)));
  assert(pri_spec->stream_id != stream->stream_id);

  if (!nghttp2_stream_in_dep_tree(stream)) {
    return 0;
  }

  if (pri_spec->stream_id != 0) {
    dep_stream = nghttp2_session_get_stream_raw(session, pri_spec->stream_id);

    if (!dep_stream &&
        session_detect_idle_stream(session, pri_spec->stream_id)) {
      nghttp2_priority_spec_default_init(&pri_spec_default);

      dep_stream = nghttp2_session_open_stream(
        session, pri_spec->stream_id, NGHTTP2_FLAG_NONE, &pri_spec_default,
        NGHTTP2_STREAM_IDLE, NULL);

      if (dep_stream == NULL) {
        return NGHTTP2_ERR_NOMEM;
      }
    } else if (!dep_stream || !nghttp2_stream_in_dep_tree(dep_stream)) {
      nghttp2_priority_spec_default_init(&pri_spec_default);
      pri_spec = &pri_spec_default;
    }
  }

  if (pri_spec->stream_id == 0) {
    dep_stream = &session->root;
  } else if (nghttp2_stream_dep_find_ancestor(dep_stream, stream)) {
    DEBUGF("stream: cycle detected, dep_stream(%p)=%d stream(%p)=%d\n",
           dep_stream, dep_stream->stream_id, stream, stream->stream_id);

    nghttp2_stream_dep_remove_subtree(dep_stream);
    rv = nghttp2_stream_dep_add_subtree(stream->dep_prev, dep_stream);
    if (rv != 0) {
      return rv;
    }
  }

  assert(dep_stream);

  if (dep_stream == stream->dep_prev && !pri_spec->exclusive) {
    /* This is minor optimization when just weight is changed. */
    nghttp2_stream_change_weight(stream, pri_spec->weight);

    return 0;
  }

  nghttp2_stream_dep_remove_subtree(stream);

  /* We have to update weight after removing stream from tree */
  stream->weight = pri_spec->weight;

  if (pri_spec->exclusive) {
    rv = nghttp2_stream_dep_insert_subtree(dep_stream, stream);
  } else {
    rv = nghttp2_stream_dep_add_subtree(dep_stream, stream);
  }

  if (rv != 0) {
    return rv;
  }

  return 0;
}